

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void updateAccumulator(Parse *pParse,int regAcc,AggInfo *pAggInfo,int eDistinctType)

{
  byte bVar1;
  Vdbe *p;
  Expr *pEVar2;
  ExprList *pList;
  FuncDef *p_00;
  bool bVar3;
  int iVar4;
  CollSeq *zP4;
  int *piVar5;
  Op *pOVar6;
  int iVar7;
  int iVar8;
  AggInfo_func *pAVar9;
  ExprList_item *pEVar10;
  bool bVar11;
  int local_6c;
  int local_68;
  int local_64;
  
  p = pParse->pVdbe;
  pAggInfo->directMode = '\x01';
  if (pAggInfo->nFunc < 1) {
    local_6c = 0;
  }
  else {
    pAVar9 = pAggInfo->aFunc;
    iVar7 = 0;
    local_6c = 0;
    do {
      pEVar2 = pAVar9->pFExpr;
      pList = (pEVar2->x).pList;
      if ((pEVar2->flags & 0x1000000) == 0) {
        local_64 = 0;
      }
      else {
        pEVar2 = ((pEVar2->y).pWin)->pFilter;
        if (((pAggInfo->nAccumulator != 0) && (regAcc != 0)) &&
           ((pAVar9->pFunc->funcFlags & 0x20) != 0)) {
          if (local_6c == 0) {
            local_6c = pParse->nMem + 1;
            pParse->nMem = local_6c;
          }
          sqlite3VdbeAddOp3(p,0x50,regAcc,local_6c,0);
        }
        local_64 = pParse->nLabel + -1;
        pParse->nLabel = local_64;
        sqlite3ExprIfFalse(pParse,pEVar2,local_64,0x10);
      }
      if (pList == (ExprList *)0x0) {
        iVar8 = 0;
        local_68 = 0;
      }
      else {
        iVar8 = pList->nExpr;
        local_68 = sqlite3GetTempRange(pParse,iVar8);
        sqlite3ExprCodeExprList(pParse,pList,local_68,0,'\x01');
      }
      iVar4 = pAVar9->iDistinct;
      if (-1 < iVar4 && pList != (ExprList *)0x0) {
        if (local_64 == 0) {
          local_64 = pParse->nLabel + -1;
          pParse->nLabel = local_64;
        }
        iVar4 = codeDistinct(pParse,eDistinctType,iVar4,local_64,pList,local_68);
        pAVar9->iDistinct = iVar4;
      }
      if ((pAVar9->pFunc->funcFlags & 0x20) != 0) {
        if (iVar8 < 1) {
          bVar11 = true;
          zP4 = (CollSeq *)0x0;
        }
        else {
          pEVar10 = pList->a;
          iVar4 = 1;
          do {
            zP4 = sqlite3ExprCollSeq(pParse,pEVar10->pExpr);
            bVar11 = zP4 == (CollSeq *)0x0;
            if (!bVar11) break;
            pEVar10 = pEVar10 + 1;
            bVar3 = iVar4 < iVar8;
            iVar4 = iVar4 + 1;
          } while (bVar3);
        }
        if (bVar11) {
          zP4 = pParse->db->pDfltColl;
        }
        if (local_6c == 0) {
          if (pAggInfo->nAccumulator == 0) {
            local_6c = 0;
          }
          else {
            local_6c = pParse->nMem + 1;
            pParse->nMem = local_6c;
          }
        }
        iVar4 = sqlite3VdbeAddOp3(p,0x55,local_6c,0,0);
        sqlite3VdbeChangeP4(p,iVar4,(char *)zP4,-2);
      }
      sqlite3VdbeAddOp3(p,0xa2,0,local_68,pAVar9->iMem);
      p_00 = pAVar9->pFunc;
      if (p->db->mallocFailed == '\0') {
        pOVar6 = p->aOp;
        iVar4 = p->nOp;
        pOVar6[(long)iVar4 + -1].p4type = -7;
        pOVar6[(long)iVar4 + -1].p4.pKeyInfo = (KeyInfo *)p_00;
      }
      else if ((p_00->funcFlags & 0x10) != 0) {
        sqlite3DbNNFreeNN(p->db,p_00);
      }
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = (ushort)iVar8 & 0xff;
      }
      if (iVar8 == 1) {
        if (local_68 != 0) {
          bVar1 = pParse->nTempReg;
          if ((ulong)bVar1 < 8) {
            pParse->nTempReg = bVar1 + 1;
            piVar5 = pParse->aTempReg + bVar1;
            goto LAB_0019aa21;
          }
        }
      }
      else if (pParse->nRangeReg < iVar8) {
        pParse->nRangeReg = iVar8;
        piVar5 = &pParse->iRangeReg;
LAB_0019aa21:
        *piVar5 = local_68;
      }
      if (local_64 != 0) {
        sqlite3VdbeResolveLabel(p,local_64);
      }
      iVar7 = iVar7 + 1;
      pAVar9 = pAVar9 + 1;
    } while (iVar7 < pAggInfo->nFunc);
  }
  if ((local_6c == 0) && (local_6c = regAcc, pAggInfo->nAccumulator == 0)) {
    local_6c = 0;
  }
  if (local_6c == 0) {
    iVar7 = 0;
  }
  else {
    iVar7 = sqlite3VdbeAddOp3(p,0x10,local_6c,0,0);
  }
  if (0 < pAggInfo->nAccumulator) {
    piVar5 = &pAggInfo->aCol->iMem;
    iVar8 = 0;
    do {
      sqlite3ExprCode(pParse,*(Expr **)(piVar5 + -3),*piVar5);
      iVar8 = iVar8 + 1;
      piVar5 = piVar5 + 8;
    } while (iVar8 < pAggInfo->nAccumulator);
  }
  pAggInfo->directMode = '\0';
  if (iVar7 != 0) {
    iVar8 = p->nOp + -1;
    if (iVar8 == iVar7) {
      p->nOp = iVar8;
    }
    else {
      if (p->db->mallocFailed == '\0') {
        pOVar6 = p->aOp + iVar7;
      }
      else {
        pOVar6 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar6->p2 = p->nOp;
    }
  }
  return;
}

Assistant:

static void updateAccumulator(
  Parse *pParse,
  int regAcc,
  AggInfo *pAggInfo,
  int eDistinctType
){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  pAggInfo->directMode = 1;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    ExprList *pList;
    assert( ExprUseXList(pF->pFExpr) );
    assert( !IsWindowFunc(pF->pFExpr) );
    pList = pF->pFExpr->x.pList;
    if( ExprHasProperty(pF->pFExpr, EP_WinFunc) ){
      Expr *pFilter = pF->pFExpr->y.pWin->pFilter;
      if( pAggInfo->nAccumulator
       && (pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL)
       && regAcc
      ){
        /* If regAcc==0, there there exists some min() or max() function
        ** without a FILTER clause that will ensure the magnet registers
        ** are populated. */
        if( regHit==0 ) regHit = ++pParse->nMem;
        /* If this is the first row of the group (regAcc contains 0), clear the
        ** "magnet" register regHit so that the accumulator registers
        ** are populated if the FILTER clause jumps over the the
        ** invocation of min() or max() altogether. Or, if this is not
        ** the first row (regAcc contains 1), set the magnet register so that
        ** the accumulators are not populated unless the min()/max() is invoked
        ** and indicates that they should be.  */
        sqlite3VdbeAddOp2(v, OP_Copy, regAcc, regHit);
      }
      addrNext = sqlite3VdbeMakeLabel(pParse);
      sqlite3ExprIfFalse(pParse, pFilter, addrNext, SQLITE_JUMPIFNULL);
    }
    if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 0, SQLITE_ECEL_DUP);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 && pList ){
      if( addrNext==0 ){
        addrNext = sqlite3VdbeMakeLabel(pParse);
      }
      pF->iDistinct = codeDistinct(pParse, eDistinctType,
          pF->iDistinct, addrNext, pList, regAgg);
    }
    if( pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
      CollSeq *pColl = 0;
      struct ExprList_item *pItem;
      int j;
      assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
      for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
        pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      }
      if( !pColl ){
        pColl = pParse->db->pDfltColl;
      }
      if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
      sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0, (char *)pColl, P4_COLLSEQ);
    }
    sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, pF->iMem);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, (u8)nArg);
    sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
    }
  }
  if( regHit==0 && pAggInfo->nAccumulator ){
    regHit = regAcc;
  }
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit); VdbeCoverage(v);
  }
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pCExpr, pC->iMem);
  }

  pAggInfo->directMode = 0;
  if( addrHitTest ){
    sqlite3VdbeJumpHereOrPopInst(v, addrHitTest);
  }
}